

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O3

void __thiscall
Annotator_retrieveDuplicateIdItemsWithIndex_Test::TestBody
          (Annotator_retrieveDuplicateIdItemsWithIndex_Test *this)

{
  _Storage *p_Var1;
  _Storage *p_Var2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  *ppVar3;
  pointer ppVar4;
  code *pcVar5;
  string sVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  char cVar10;
  undefined4 uVar11;
  mapped_type *pmVar12;
  void *pvVar13;
  undefined8 *puVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  *ppVar15;
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  *this_00;
  pointer __k;
  long lVar16;
  char *pcVar17;
  long lVar18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var19;
  long lVar20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var21;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::pair<libcellml::CellmlElementType,_std::any>_> __l_00;
  initializer_list<std::pair<libcellml::CellmlElementType,_std::any>_> __l_01;
  initializer_list<std::pair<libcellml::CellmlElementType,_std::any>_> __l_02;
  initializer_list<std::pair<libcellml::CellmlElementType,_std::any>_> __l_03;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>
  __l_04;
  ModelPtr model;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar;
  AnyCellmlElementPtr item;
  VariablePtr c4v2;
  VariablePtr c2v2;
  VariablePtr c2v1;
  VariablePtr c3v1;
  VariablePtr c4v1;
  AnnotatorPtr annotator;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
  expectedItems;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ids;
  ParserPtr parser;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_9f0;
  undefined8 local_9d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_9d0;
  allocator_type local_9c6;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_9c5;
  allocator_type local_9c4;
  allocator_type local_9c3;
  allocator_type local_9c2;
  allocator_type local_9c1;
  pair<libcellml::CellmlElementType,_std::any> local_9c0;
  undefined4 local_9a8;
  code *local_9a0;
  undefined8 *local_998;
  undefined4 local_990;
  code *local_988;
  undefined8 *local_980;
  undefined4 local_978;
  code *local_970;
  undefined8 *local_968;
  undefined4 local_960;
  code *local_958;
  undefined8 *local_950;
  undefined4 local_948;
  code *local_940;
  undefined8 *local_938;
  undefined4 local_930;
  code *local_928;
  undefined8 *local_920;
  pair<libcellml::CellmlElementType,_std::any> local_918;
  undefined4 local_900;
  code *local_8f8;
  undefined8 *local_8f0;
  undefined4 local_8e8;
  code *local_8e0;
  undefined8 *local_8d8;
  undefined4 local_8d0;
  code *local_8c8;
  undefined8 *local_8c0;
  undefined4 local_8b8;
  code *local_8b0;
  undefined8 *local_8a8;
  undefined4 local_8a0;
  code *local_898;
  undefined8 *local_890;
  undefined4 local_888;
  code *local_880;
  undefined8 *local_878;
  undefined4 local_870;
  code *local_868;
  undefined8 *local_860;
  pair<libcellml::CellmlElementType,_std::any> local_850;
  undefined4 local_838;
  code *local_830;
  undefined8 *local_828;
  undefined4 local_820;
  code *local_818;
  undefined8 *local_810;
  undefined4 local_808;
  code *local_800;
  undefined8 *local_7f8;
  undefined4 local_7f0;
  code *local_7e8;
  undefined8 *local_7e0;
  undefined4 local_7d8;
  code *local_7d0;
  undefined8 *local_7c8;
  undefined4 local_7c0;
  code *local_7b8;
  undefined8 *local_7b0;
  shared_ptr<libcellml::Units> local_7a8;
  long local_798 [2];
  undefined1 local_788 [32];
  pointer local_768;
  undefined1 local_758 [16];
  undefined1 *local_748 [2];
  undefined1 local_738 [16];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  *local_728 [2];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  local_718;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  local_6e0;
  undefined8 local_6a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_6a0;
  undefined8 local_698;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_690;
  undefined8 local_688;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_680;
  undefined8 local_678;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_670;
  undefined8 local_668;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_660;
  undefined8 local_658;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_650;
  undefined8 local_648;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_640;
  undefined8 local_638;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_630;
  undefined8 local_628;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_620;
  undefined8 local_618;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_610;
  undefined8 local_608;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_600;
  undefined8 local_5f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_5f0;
  undefined8 local_5e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_5e0;
  undefined8 local_5d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_5d0;
  undefined8 local_5c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_5c0;
  undefined8 local_5b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_5b0;
  undefined8 local_5a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_5a0;
  undefined8 local_598;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_590;
  undefined8 local_588;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_580;
  undefined8 local_578;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_570;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_560;
  undefined8 local_558;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_550;
  pair<libcellml::CellmlElementType,_std::any> local_548;
  undefined4 local_530;
  code *local_528;
  undefined8 *local_520;
  undefined4 local_518;
  code *local_510;
  undefined8 *local_508;
  undefined4 local_500;
  code *local_4f8;
  undefined8 *local_4f0;
  undefined4 local_4e8;
  code *local_4e0;
  undefined8 *local_4d8;
  undefined4 local_4d0;
  code *local_4c8;
  undefined8 *local_4c0;
  undefined4 local_4b8;
  code *local_4b0;
  undefined8 *local_4a8;
  undefined4 local_4a0;
  code *local_498;
  undefined8 *local_490;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
  local_488;
  long *local_458 [2];
  long local_448 [2];
  long *local_438 [2];
  long local_428 [2];
  long *local_418 [2];
  long local_408 [2];
  long *local_3f8 [2];
  long local_3e8 [2];
  long *local_3d8 [2];
  long local_3c8 [2];
  long *local_3b8 [2];
  long local_3a8 [2];
  long *local_398 [2];
  long local_388 [2];
  long *local_378 [2];
  long local_368 [2];
  long *local_358 [2];
  long local_348 [2];
  long *local_338 [2];
  long local_328 [2];
  long *local_318 [2];
  long local_308 [2];
  long *local_2f8 [2];
  long local_2e8 [2];
  long *local_2d8 [2];
  long local_2c8 [2];
  long *local_2b8 [2];
  long local_2a8 [2];
  long *local_298 [2];
  long local_288 [2];
  long *local_278 [2];
  long local_268 [2];
  long *local_258 [2];
  long local_248 [2];
  long *local_238 [2];
  long local_228 [2];
  long *local_218 [2];
  long local_208 [2];
  key_type *local_1f8;
  string local_1f0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1e8;
  string local_1e0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1d8;
  string local_1d0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1c8;
  string local_1c0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1b8;
  string local_1b0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1a8;
  string local_1a0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_198;
  string local_190 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_188;
  string local_180 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_178;
  string local_170 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_168;
  string local_160 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_158;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_150;
  long *local_138 [2];
  long local_128 [2];
  undefined8 local_118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_110;
  undefined8 local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_100;
  undefined8 local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_f0;
  undefined8 local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_e0;
  undefined8 local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_d0;
  undefined8 local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_c0;
  undefined8 local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_b0;
  undefined1 local_a0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  local_90;
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  local_78;
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  local_60;
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  local_48;
  
  local_788._0_8_ = local_788 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_788,"duplicateId1","");
  local_768 = (pointer)local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"duplicateId2","");
  local_748[0] = local_738;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_748,"duplicateId3","");
  ppVar15 = &local_718;
  local_728[0] = ppVar15;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_728,"duplicateId4","");
  __l._M_len = 4;
  __l._M_array = (iterator)local_788;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_150,__l,(allocator_type *)&local_548);
  lVar20 = -0x80;
  do {
    ppVar3 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
              *)ppVar15[-1].second.
                super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar15 != ppVar3) {
      operator_delete(ppVar3,(ulong)((ppVar15->first)._M_dataplus._M_p + 1));
    }
    ppVar15 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
               *)((long)&ppVar15[-1].first.field_2 + 8);
    lVar20 = lVar20 + 0x20;
  } while (lVar20 != 0);
  libcellml::Parser::create(SUB81(local_a0,0));
  libcellml::Parser::parseModel((string *)&local_9d8);
  uVar7 = local_9d8;
  local_788._0_8_ = local_788 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_788,"component2","");
  libcellml::ComponentEntity::component((string *)&local_918,SUB81(uVar7,0));
  p_Var1 = &local_548.second._M_storage;
  local_548._0_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"variable1","");
  libcellml::Component::variable((string *)&local_688);
  if ((_Storage *)local_548._0_8_ != p_Var1) {
    operator_delete((void *)local_548._0_8_,(long)local_548.second._M_storage._M_ptr + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_918.second._M_manager !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_918.second._M_manager);
  }
  if ((undefined1 *)local_788._0_8_ != local_788 + 0x10) {
    operator_delete((void *)local_788._0_8_,local_788._16_8_ + 1);
  }
  uVar7 = local_9d8;
  local_788._0_8_ = local_788 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_788,"component2","");
  libcellml::ComponentEntity::component((string *)&local_918,SUB81(uVar7,0));
  local_548._0_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"variable2","");
  libcellml::Component::variable((string *)&local_698);
  if ((_Storage *)local_548._0_8_ != p_Var1) {
    operator_delete((void *)local_548._0_8_,(long)local_548.second._M_storage._M_ptr + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_918.second._M_manager !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_918.second._M_manager);
  }
  if ((undefined1 *)local_788._0_8_ != local_788 + 0x10) {
    operator_delete((void *)local_788._0_8_,local_788._16_8_ + 1);
  }
  uVar7 = local_9d8;
  local_788._0_8_ = local_788 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_788,"component2","");
  libcellml::ComponentEntity::component((string *)&local_850,SUB81(uVar7,0));
  uVar7 = local_850._0_8_;
  local_548._0_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"component3","");
  libcellml::ComponentEntity::component((string *)&local_9c0,SUB81(uVar7,0));
  p_Var2 = &local_918.second._M_storage;
  local_918._0_8_ = p_Var2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_918,"variable1","");
  libcellml::Component::variable((string *)&local_678);
  if ((_Storage *)local_918._0_8_ != p_Var2) {
    operator_delete((void *)local_918._0_8_,(long)local_918.second._M_storage._M_ptr + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager);
  }
  if ((_Storage *)local_548._0_8_ != p_Var1) {
    operator_delete((void *)local_548._0_8_,(long)local_548.second._M_storage._M_ptr + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_850.second._M_manager !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_850.second._M_manager);
  }
  if ((undefined1 *)local_788._0_8_ != local_788 + 0x10) {
    operator_delete((void *)local_788._0_8_,local_788._16_8_ + 1);
  }
  uVar7 = local_9d8;
  local_788._0_8_ = local_788 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_788,"component4","");
  libcellml::ComponentEntity::component((string *)&local_918,SUB81(uVar7,0));
  local_548._0_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"variable1","");
  libcellml::Component::variable((string *)&local_558);
  if ((_Storage *)local_548._0_8_ != p_Var1) {
    operator_delete((void *)local_548._0_8_,(long)local_548.second._M_storage._M_ptr + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_918.second._M_manager !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_918.second._M_manager);
  }
  if ((undefined1 *)local_788._0_8_ != local_788 + 0x10) {
    operator_delete((void *)local_788._0_8_,local_788._16_8_ + 1);
  }
  uVar7 = local_9d8;
  local_788._0_8_ = local_788 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_788,"component4","");
  libcellml::ComponentEntity::component((string *)&local_918,SUB81(uVar7,0));
  local_548._0_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"variable2","");
  libcellml::Component::variable((string *)&local_6a8);
  if ((_Storage *)local_548._0_8_ != p_Var1) {
    operator_delete((void *)local_548._0_8_,(long)local_548.second._M_storage._M_ptr + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_918.second._M_manager !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_918.second._M_manager);
  }
  if ((undefined1 *)local_788._0_8_ != local_788 + 0x10) {
    operator_delete((void *)local_788._0_8_,local_788._16_8_ + 1);
  }
  local_7a8.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_798;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"units2","");
  libcellml::Model::units((string *)&local_578);
  p_Var21 = p_Stack_570;
  uVar8 = local_578;
  local_578 = 0;
  p_Stack_570 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_548.first = 0xd;
  local_548.second._M_manager =
       std::any::_Manager_external<std::shared_ptr<libcellml::Units>_>::_S_manage;
  local_548.second._M_storage._M_ptr = (void *)0x0;
  local_548.second._M_storage._M_ptr = operator_new(0x10);
  uVar7 = local_9d8;
  *(undefined8 *)local_548.second._M_storage._M_ptr = uVar8;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_548.second._M_storage._M_ptr + 8) =
       p_Var21;
  local_218[0] = local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"component1","");
  libcellml::ComponentEntity::component(local_160,SUB81(uVar7,0));
  libcellml::ImportedEntity::importSource();
  p_Var21 = p_Stack_580;
  uVar7 = local_588;
  local_588 = 0;
  p_Stack_580 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_530 = 4;
  local_528 = std::any::_Manager_external<std::shared_ptr<libcellml::ImportSource>_>::_S_manage;
  local_520 = (undefined8 *)0x0;
  local_520 = (undefined8 *)operator_new(0x10);
  *local_520 = uVar7;
  local_520[1] = p_Var21;
  libcellml::VariablePair::create((shared_ptr *)&local_b8,(shared_ptr *)&local_558);
  p_Var21 = p_Stack_b0;
  uVar8 = local_b8;
  local_b8 = 0;
  p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_518 = 5;
  local_510 = std::any::_Manager_external<std::shared_ptr<libcellml::VariablePair>_>::_S_manage;
  local_508 = (undefined8 *)0x0;
  local_508 = (undefined8 *)operator_new(0x10);
  uVar7 = local_9d8;
  *local_508 = uVar8;
  local_508[1] = p_Var21;
  local_238[0] = local_228;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"component2","");
  libcellml::ComponentEntity::component((string *)&local_598,SUB81(uVar7,0));
  p_Var21 = p_Stack_590;
  uVar7 = local_598;
  local_598 = 0;
  p_Stack_590 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_500 = 0;
  local_4f8 = std::any::_Manager_external<std::shared_ptr<libcellml::Component>_>::_S_manage;
  local_4f0 = (undefined8 *)0x0;
  local_4f0 = (undefined8 *)operator_new(0x10);
  *local_4f0 = uVar7;
  local_4f0[1] = p_Var21;
  libcellml::VariablePair::create((shared_ptr *)&local_c8,(shared_ptr *)&local_688);
  p_Var21 = p_Stack_c0;
  uVar8 = local_c8;
  local_c8 = 0;
  p_Stack_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_4e8 = 2;
  local_4e0 = std::any::_Manager_external<std::shared_ptr<libcellml::VariablePair>_>::_S_manage;
  local_4d8 = (undefined8 *)0x0;
  local_4d8 = (undefined8 *)operator_new(0x10);
  uVar7 = local_9d8;
  *local_4d8 = uVar8;
  local_4d8[1] = p_Var21;
  local_258[0] = local_248;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"component2","");
  libcellml::ComponentEntity::component(local_170,SUB81(uVar7,0));
  libcellml::Component::reset((ulong)&local_5a8);
  p_Var21 = p_Stack_5a0;
  uVar8 = local_5a8;
  local_5a8 = 0;
  p_Stack_5a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_4d0 = 10;
  local_4c8 = std::any::_Manager_external<std::shared_ptr<libcellml::Reset>_>::_S_manage;
  local_4c0 = (undefined8 *)0x0;
  local_4c0 = (undefined8 *)operator_new(0x10);
  uVar7 = local_9d8;
  *local_4c0 = uVar8;
  local_4c0[1] = p_Var21;
  local_278[0] = local_268;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"component2","");
  libcellml::ComponentEntity::component(local_180,SUB81(uVar7,0));
  local_298[0] = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"component3","");
  libcellml::ComponentEntity::component((string *)&local_5b8,(bool)local_180[0]);
  p_Var21 = p_Stack_5b0;
  uVar8 = local_5b8;
  local_5b8 = 0;
  p_Stack_5b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_4b8 = 1;
  local_4b0 = std::any::_Manager_external<std::shared_ptr<libcellml::Component>_>::_S_manage;
  local_4a8 = (undefined8 *)0x0;
  local_4a8 = (undefined8 *)operator_new(0x10);
  uVar7 = local_9d8;
  *local_4a8 = uVar8;
  local_4a8[1] = p_Var21;
  local_2b8[0] = local_2a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"component2","");
  libcellml::ComponentEntity::component(local_1a0,SUB81(uVar7,0));
  local_2d8[0] = local_2c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"component3","");
  libcellml::ComponentEntity::component(local_190,(bool)local_1a0[0]);
  local_2f8[0] = local_2e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"variable2","");
  libcellml::Component::variable((string *)&local_5c8);
  p_Var21 = p_Stack_5c0;
  uVar7 = local_5c8;
  local_5c8 = 0;
  p_Stack_5c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_4a0 = 0xe;
  local_498 = std::any::_Manager_external<std::shared_ptr<libcellml::Variable>_>::_S_manage;
  local_490 = (undefined8 *)0x0;
  local_490 = (undefined8 *)operator_new(0x10);
  *local_490 = uVar7;
  local_490[1] = p_Var21;
  __l_00._M_len = 8;
  __l_00._M_array = &local_548;
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::vector(&local_48,__l_00,&local_9c1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  ::pair<const_char_(&)[13],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
              *)local_788,(char (*) [13])"duplicateId1",&local_48);
  p_Var21 = local_9d0;
  uVar7 = local_9d8;
  if (local_9d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_9d0 + 8) = *(int *)(local_9d0 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_9d0 + 8) = *(int *)(local_9d0 + 8) + 1;
    }
  }
  local_918.first = MODEL;
  local_918.second._M_manager =
       std::any::_Manager_external<std::shared_ptr<libcellml::Model>_>::_S_manage;
  local_918.second._M_storage._M_ptr = (void *)0x0;
  local_918.second._M_storage._M_ptr = operator_new(0x10);
  *(undefined8 *)local_918.second._M_storage._M_ptr = uVar7;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_918.second._M_storage._M_ptr + 8) =
       p_Var21;
  local_318[0] = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"units1","");
  libcellml::Model::units((string *)&local_5d8);
  p_Var21 = p_Stack_5d0;
  uVar7 = local_5d8;
  local_5d8 = 0;
  p_Stack_5d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_900 = 0xd;
  local_8f8 = std::any::_Manager_external<std::shared_ptr<libcellml::Units>_>::_S_manage;
  local_8f0 = (undefined8 *)0x0;
  local_8f0 = (undefined8 *)operator_new(0x10);
  *local_8f0 = uVar7;
  local_8f0[1] = p_Var21;
  local_338[0] = local_328;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"blob","");
  libcellml::Model::units((string *)&local_5e8);
  p_Var21 = p_Stack_5e0;
  uVar7 = local_5e8;
  local_5e8 = 0;
  p_Stack_5e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_8e8 = 0xd;
  local_8e0 = std::any::_Manager_external<std::shared_ptr<libcellml::Units>_>::_S_manage;
  local_8d8 = (undefined8 *)0x0;
  local_8d8 = (undefined8 *)operator_new(0x10);
  *local_8d8 = uVar7;
  local_8d8[1] = p_Var21;
  libcellml::VariablePair::create((shared_ptr *)&local_d8,(shared_ptr *)&local_6a8);
  p_Var19 = p_Stack_d0;
  uVar7 = local_d8;
  local_d8 = 0;
  p_Stack_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_8d0 = 2;
  local_8c8 = std::any::_Manager_external<std::shared_ptr<libcellml::VariablePair>_>::_S_manage;
  local_8c0 = (undefined8 *)0x0;
  local_8c0 = (undefined8 *)operator_new(0x10);
  p_Var21 = local_6a0;
  *local_8c0 = uVar7;
  local_8c0[1] = p_Var19;
  if (local_6a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_6a0 + 8) = *(int *)(local_6a0 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_6a0 + 8) = *(int *)(local_6a0 + 8) + 1;
    }
  }
  local_8b8 = 0xe;
  local_8b0 = std::any::_Manager_external<std::shared_ptr<libcellml::Variable>_>::_S_manage;
  local_8a8 = (undefined8 *)0x0;
  local_8a8 = (undefined8 *)operator_new(0x10);
  uVar7 = local_9d8;
  *local_8a8 = local_6a8;
  local_8a8[1] = p_Var21;
  local_358[0] = local_348;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"component2","");
  libcellml::ComponentEntity::component((string *)&local_5f8,SUB81(uVar7,0));
  p_Var21 = p_Stack_5f0;
  uVar8 = local_5f8;
  local_5f8 = 0;
  p_Stack_5f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_8a0 = 1;
  local_898 = std::any::_Manager_external<std::shared_ptr<libcellml::Component>_>::_S_manage;
  local_890 = (undefined8 *)0x0;
  local_890 = (undefined8 *)operator_new(0x10);
  uVar7 = local_9d8;
  *local_890 = uVar8;
  local_890[1] = p_Var21;
  local_378[0] = local_368;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"component2","");
  libcellml::ComponentEntity::component(local_1b0,SUB81(uVar7,0));
  libcellml::Component::reset((ulong)&local_608);
  p_Var19 = p_Stack_600;
  uVar7 = local_608;
  local_608 = 0;
  p_Stack_600 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_888 = 8;
  local_880 = std::any::_Manager_external<std::shared_ptr<libcellml::Reset>_>::_S_manage;
  local_878 = (undefined8 *)0x0;
  local_878 = (undefined8 *)operator_new(0x10);
  p_Var21 = local_670;
  *local_878 = uVar7;
  local_878[1] = p_Var19;
  if (local_670 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_670 + 8) = *(int *)(local_670 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_670 + 8) = *(int *)(local_670 + 8) + 1;
    }
  }
  local_870 = 0xe;
  local_868 = std::any::_Manager_external<std::shared_ptr<libcellml::Variable>_>::_S_manage;
  local_860 = (undefined8 *)0x0;
  local_860 = (undefined8 *)operator_new(0x10);
  *local_860 = local_678;
  local_860[1] = p_Var21;
  __l_01._M_len = 8;
  __l_01._M_array = &local_918;
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::vector(&local_60,__l_01,&local_9c2);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  ::pair<const_char_(&)[13],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
              *)(local_758 + 8),(char (*) [13])"duplicateId2",&local_60);
  local_398[0] = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"units1","");
  libcellml::Model::units(local_1c0);
  libcellml::ImportedEntity::importSource();
  p_Var21 = p_Stack_610;
  uVar7 = local_618;
  local_618 = 0;
  p_Stack_610 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_9c0.first = 4;
  local_9c0.second._M_manager =
       std::any::_Manager_external<std::shared_ptr<libcellml::ImportSource>_>::_S_manage;
  local_9c0.second._M_storage._M_ptr = (void *)0x0;
  local_9c0.second._M_storage._M_ptr = operator_new(0x10);
  *(undefined8 *)local_9c0.second._M_storage._M_ptr = uVar7;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_9c0.second._M_storage._M_ptr + 8) =
       p_Var21;
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"units3","");
  libcellml::Model::units((string *)&local_628);
  p_Var21 = p_Stack_620;
  uVar7 = local_628;
  local_628 = 0;
  p_Stack_620 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_9a8 = 0xd;
  local_9a0 = std::any::_Manager_external<std::shared_ptr<libcellml::Units>_>::_S_manage;
  local_998 = (undefined8 *)0x0;
  local_998 = (undefined8 *)operator_new(0x10);
  p_Var19 = local_550;
  *local_998 = uVar7;
  local_998[1] = p_Var21;
  if (local_550 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_550 + 8) = *(int *)(local_550 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_550 + 8) = *(int *)(local_550 + 8) + 1;
    }
  }
  local_990 = 0xe;
  local_988 = std::any::_Manager_external<std::shared_ptr<libcellml::Variable>_>::_S_manage;
  local_980 = (undefined8 *)0x0;
  local_980 = (undefined8 *)operator_new(0x10);
  p_Var21 = local_690;
  *local_980 = local_558;
  local_980[1] = p_Var19;
  if (local_690 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_690 + 8) = *(int *)(local_690 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_690 + 8) = *(int *)(local_690 + 8) + 1;
    }
  }
  local_978 = 0xe;
  local_970 = std::any::_Manager_external<std::shared_ptr<libcellml::Variable>_>::_S_manage;
  local_968 = (undefined8 *)0x0;
  local_968 = (undefined8 *)operator_new(0x10);
  *local_968 = local_698;
  local_968[1] = p_Var21;
  libcellml::VariablePair::create((shared_ptr *)&local_e8,(shared_ptr *)&local_698);
  p_Var21 = p_Stack_e0;
  uVar8 = local_e8;
  local_e8 = 0;
  p_Stack_e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_960 = 5;
  local_958 = std::any::_Manager_external<std::shared_ptr<libcellml::VariablePair>_>::_S_manage;
  local_950 = (undefined8 *)0x0;
  local_950 = (undefined8 *)operator_new(0x10);
  uVar7 = local_9d8;
  *local_950 = uVar8;
  local_950[1] = p_Var21;
  local_3d8[0] = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"component2","");
  libcellml::ComponentEntity::component(local_1d0,SUB81(uVar7,0));
  local_3f8[0] = local_3e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"component3","");
  libcellml::ComponentEntity::component((string *)&local_638,(bool)local_1d0[0]);
  p_Var19 = p_Stack_630;
  uVar8 = local_638;
  local_638 = 0;
  p_Stack_630 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_948 = 0;
  local_940 = std::any::_Manager_external<std::shared_ptr<libcellml::Component>_>::_S_manage;
  local_938 = (undefined8 *)0x0;
  local_938 = (undefined8 *)operator_new(0x10);
  p_Var21 = local_9d0;
  uVar7 = local_9d8;
  *local_938 = uVar8;
  local_938[1] = p_Var19;
  if (local_9d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_9d0 + 8) = *(int *)(local_9d0 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_9d0 + 8) = *(int *)(local_9d0 + 8) + 1;
    }
  }
  local_930 = 3;
  local_928 = std::any::_Manager_external<std::shared_ptr<libcellml::Model>_>::_S_manage;
  local_920 = (undefined8 *)0x0;
  local_920 = (undefined8 *)operator_new(0x10);
  *local_920 = uVar7;
  local_920[1] = p_Var21;
  __l_02._M_len = 7;
  __l_02._M_array = &local_9c0;
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::vector(&local_78,__l_02,&local_9c3);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  ::pair<const_char_(&)[13],_true>(&local_718,(char (*) [13])"duplicateId3",&local_78);
  local_418[0] = local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"units2","");
  libcellml::Model::units(local_1e0);
  libcellml::UnitsItem::create((shared_ptr *)&local_f8,(ulong)local_1e0);
  p_Var21 = p_Stack_f0;
  uVar7 = local_f8;
  local_f8 = 0;
  p_Stack_f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_850.first = 0xc;
  local_850.second._M_manager =
       std::any::_Manager_external<std::shared_ptr<libcellml::UnitsItem>_>::_S_manage;
  local_850.second._M_storage._M_ptr = (void *)0x0;
  local_850.second._M_storage._M_ptr = operator_new(0x10);
  sVar6 = local_9d8._0_1_;
  *(undefined8 *)local_850.second._M_storage._M_ptr = uVar7;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_850.second._M_storage._M_ptr + 8) =
       p_Var21;
  local_438[0] = local_428;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"component1","");
  libcellml::ComponentEntity::component((string *)&local_648,(bool)sVar6);
  p_Var21 = p_Stack_640;
  uVar7 = local_648;
  local_648 = 0;
  p_Stack_640 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_838 = 0;
  local_830 = std::any::_Manager_external<std::shared_ptr<libcellml::Component>_>::_S_manage;
  local_828 = (undefined8 *)0x0;
  local_828 = (undefined8 *)operator_new(0x10);
  sVar6 = local_9d8._0_1_;
  *local_828 = uVar7;
  local_828[1] = p_Var21;
  local_458[0] = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"component4","");
  libcellml::ComponentEntity::component((string *)&local_658,(bool)sVar6);
  p_Var21 = p_Stack_650;
  uVar7 = local_658;
  local_658 = 0;
  p_Stack_650 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_820 = 0;
  local_818 = std::any::_Manager_external<std::shared_ptr<libcellml::Component>_>::_S_manage;
  local_810 = (undefined8 *)0x0;
  local_810 = (undefined8 *)operator_new(0x10);
  *local_810 = uVar7;
  local_810[1] = p_Var21;
  libcellml::VariablePair::create((shared_ptr *)&local_108,(shared_ptr *)&local_688);
  p_Var19 = p_Stack_100;
  uVar7 = local_108;
  local_108 = 0;
  p_Stack_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_808 = 5;
  local_800 = std::any::_Manager_external<std::shared_ptr<libcellml::VariablePair>_>::_S_manage;
  local_7f8 = (undefined8 *)0x0;
  local_7f8 = (undefined8 *)operator_new(0x10);
  p_Var21 = local_680;
  *local_7f8 = uVar7;
  local_7f8[1] = p_Var19;
  if (local_680 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_680 + 8) = *(int *)(local_680 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_680 + 8) = *(int *)(local_680 + 8) + 1;
    }
  }
  local_7f0 = 0xe;
  local_7e8 = std::any::_Manager_external<std::shared_ptr<libcellml::Variable>_>::_S_manage;
  local_7e0 = (undefined8 *)0x0;
  local_7e0 = (undefined8 *)operator_new(0x10);
  *local_7e0 = local_688;
  local_7e0[1] = p_Var21;
  libcellml::VariablePair::create((shared_ptr *)&local_118,(shared_ptr *)&local_698);
  p_Var21 = p_Stack_110;
  uVar7 = local_118;
  local_118 = 0;
  p_Stack_110 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_7d8 = 5;
  local_7d0 = std::any::_Manager_external<std::shared_ptr<libcellml::VariablePair>_>::_S_manage;
  local_7c8 = (undefined8 *)0x0;
  local_7c8 = (undefined8 *)operator_new(0x10);
  *local_7c8 = uVar7;
  local_7c8[1] = p_Var21;
  local_138[0] = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"component2","");
  libcellml::ComponentEntity::component(local_1f0,(bool)local_9d8._0_1_);
  libcellml::Component::reset((ulong)&local_668);
  p_Var21 = p_Stack_660;
  uVar7 = local_668;
  local_668 = 0;
  p_Stack_660 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_7c0 = 9;
  local_7b8 = std::any::_Manager_external<std::shared_ptr<libcellml::Reset>_>::_S_manage;
  local_7b0 = (undefined8 *)0x0;
  local_7b0 = (undefined8 *)operator_new(0x10);
  *local_7b0 = uVar7;
  local_7b0[1] = p_Var21;
  __l_03._M_len = 7;
  __l_03._M_array = &local_850;
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::vector(&local_90,__l_03,&local_9c4);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  ::pair<const_char_(&)[13],_true>(&local_6e0,(char (*) [13])"duplicateId4",&local_90);
  __l_04._M_len = 4;
  __l_04._M_array = (iterator)local_788;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
         *)&local_488,__l_04,&local_9c5,&local_9c6);
  lVar20 = -0xe0;
  this_00 = &local_6e0.second;
  do {
    std::
    vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
    ::~vector(this_00);
    ppVar4 = this_00[-2].
             super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if ((pointer)((long)(this_00 + -1) + 8) != ppVar4) {
      operator_delete(ppVar4,(ulong)((long)&((pointer)
                                            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                              *)((long)(this_00 + -1) + 8))->_M_allocated_capacity)
                                            ->first + 1));
    }
    this_00 = (vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
               *)&this_00[-3].
                  super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    lVar20 = lVar20 + 0x38;
  } while (lVar20 != 0);
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::~vector(&local_90);
  lVar20 = 0x98;
  do {
    pcVar5 = *(code **)((long)&local_850.first + lVar20);
    if (pcVar5 != (code *)0x0) {
      puVar14 = (undefined8 *)((long)&local_850.first + lVar20);
      (*pcVar5)(3,puVar14,0);
      *puVar14 = 0;
    }
    lVar20 = lVar20 + -0x18;
  } while (lVar20 != -0x10);
  if (p_Stack_660 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_660);
  }
  if (local_1e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e8);
  }
  if (local_138[0] != local_128) {
    operator_delete(local_138[0],local_128[0] + 1);
  }
  if (p_Stack_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_110);
  }
  if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_100);
  }
  if (p_Stack_650 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_650);
  }
  if (local_458[0] != local_448) {
    operator_delete(local_458[0],local_448[0] + 1);
  }
  if (p_Stack_640 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_640);
  }
  if (local_438[0] != local_428) {
    operator_delete(local_438[0],local_428[0] + 1);
  }
  if (p_Stack_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_f0);
  }
  if (local_1d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d8);
  }
  if (local_418[0] != local_408) {
    operator_delete(local_418[0],local_408[0] + 1);
  }
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::~vector(&local_78);
  lVar20 = 0x98;
  do {
    pcVar5 = *(code **)((long)&local_9c0.first + lVar20);
    if (pcVar5 != (code *)0x0) {
      puVar14 = (undefined8 *)((long)&local_9c0.first + lVar20);
      (*pcVar5)(3,puVar14,0);
      *puVar14 = 0;
    }
    lVar20 = lVar20 + -0x18;
  } while (lVar20 != -0x10);
  if (p_Stack_630 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_630);
  }
  if (local_3f8[0] != local_3e8) {
    operator_delete(local_3f8[0],local_3e8[0] + 1);
  }
  if (local_1c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1c8);
  }
  if (local_3d8[0] != local_3c8) {
    operator_delete(local_3d8[0],local_3c8[0] + 1);
  }
  if (p_Stack_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_e0);
  }
  if (p_Stack_620 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_620);
  }
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  if (p_Stack_610 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_610);
  }
  if (local_1b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1b8);
  }
  if (local_398[0] != local_388) {
    operator_delete(local_398[0],local_388[0] + 1);
  }
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::~vector(&local_60);
  lVar20 = 0xb0;
  do {
    pcVar5 = *(code **)((long)&local_918.first + lVar20);
    if (pcVar5 != (code *)0x0) {
      puVar14 = (undefined8 *)((long)&local_918.first + lVar20);
      (*pcVar5)(3,puVar14,0);
      *puVar14 = 0;
    }
    lVar20 = lVar20 + -0x18;
  } while (lVar20 != -0x10);
  if (p_Stack_600 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_600);
  }
  if (local_1a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a8);
  }
  if (local_378[0] != local_368) {
    operator_delete(local_378[0],local_368[0] + 1);
  }
  if (p_Stack_5f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_5f0);
  }
  if (local_358[0] != local_348) {
    operator_delete(local_358[0],local_348[0] + 1);
  }
  if (p_Stack_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_d0);
  }
  if (p_Stack_5e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_5e0);
  }
  if (local_338[0] != local_328) {
    operator_delete(local_338[0],local_328[0] + 1);
  }
  if (p_Stack_5d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_5d0);
  }
  if (local_318[0] != local_308) {
    operator_delete(local_318[0],local_308[0] + 1);
  }
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::~vector(&local_48);
  lVar20 = 0xb0;
  do {
    pcVar5 = *(code **)((long)&local_548.first + lVar20);
    if (pcVar5 != (code *)0x0) {
      puVar14 = (undefined8 *)((long)&local_548.first + lVar20);
      (*pcVar5)(3,puVar14,0);
      *puVar14 = 0;
    }
    lVar20 = lVar20 + -0x18;
  } while (lVar20 != -0x10);
  if (p_Stack_5c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_5c0);
  }
  if (local_2f8[0] != local_2e8) {
    operator_delete(local_2f8[0],local_2e8[0] + 1);
  }
  if (local_188 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_188);
  }
  if (local_2d8[0] != local_2c8) {
    operator_delete(local_2d8[0],local_2c8[0] + 1);
  }
  if (local_198 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_198);
  }
  if (local_2b8[0] != local_2a8) {
    operator_delete(local_2b8[0],local_2a8[0] + 1);
  }
  if (p_Stack_5b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_5b0);
  }
  if (local_298[0] != local_288) {
    operator_delete(local_298[0],local_288[0] + 1);
  }
  if (local_178 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178);
  }
  if (local_278[0] != local_268) {
    operator_delete(local_278[0],local_268[0] + 1);
  }
  if (p_Stack_5a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_5a0);
  }
  if (local_168 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_168);
  }
  if (local_258[0] != local_248) {
    operator_delete(local_258[0],local_248[0] + 1);
  }
  if (p_Stack_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_c0);
  }
  if (p_Stack_590 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_590);
  }
  if (local_238[0] != local_228) {
    operator_delete(local_238[0],local_228[0] + 1);
  }
  if (p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
  }
  if (p_Stack_580 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_580);
  }
  if (local_158 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_158);
  }
  if (local_218[0] != local_208) {
    operator_delete(local_218[0],local_208[0] + 1);
  }
  if (p_Stack_570 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_570);
  }
  if (local_7a8.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_798) {
    operator_delete(local_7a8.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_798[0] + 1);
  }
  libcellml::Annotator::create();
  libcellml::Annotator::setModel((shared_ptr *)local_548._0_8_);
  libcellml::Annotator::duplicateIds_abi_cxx11_();
  testing::internal::
  CmpHelperEQ<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((internal *)&local_918,"ids","annotator->duplicateIds()",&local_150,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_788);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_788);
  if ((undefined1)local_918.first == COMPONENT) {
    testing::Message::Message((Message *)local_788);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_918.second._M_manager ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar17 = "";
    }
    else {
      pcVar17 = *(char **)local_918.second._M_manager;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_9c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x7b2,pcVar17);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_9c0,(Message *)local_788);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_9c0);
    if ((((long *)local_788._0_8_ != (long *)0x0) &&
        (cVar10 = testing::internal::IsTrue(true), cVar10 != '\0')) &&
       ((long *)local_788._0_8_ != (long *)0x0)) {
      (**(code **)(*(long *)local_788._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_918.second,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1f8 = local_150.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_150.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_150.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_9f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    __k = local_150.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    do {
      lVar20 = libcellml::Annotator::itemCount((string *)local_548._0_8_);
      p_Var21 = local_9f0;
      if (lVar20 != 0) {
        lVar16 = 8;
        lVar18 = 0;
        do {
          libcellml::Annotator::item((string *)local_788,local_548._0_8_);
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                  *)&local_488,__k);
          ppVar4 = (pmVar12->
                   super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          uVar11 = libcellml::AnyCellmlElement::type();
          local_9c0.first = uVar11;
          testing::internal::CmpHelperEQ<libcellml::CellmlElementType,libcellml::CellmlElementType>
                    ((internal *)&local_918,"expectedItems[id][index].first","item->type()",
                     (CellmlElementType *)((long)ppVar4 + lVar16 + -8),&local_9c0.first);
          if ((undefined1)local_918.first == COMPONENT) {
            testing::Message::Message((Message *)&local_9c0);
            pcVar17 = "";
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_918.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              pcVar17 = *(char **)local_918.second._M_manager;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_850,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                       ,0x7b9,pcVar17);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_850,(Message *)&local_9c0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_850);
            if ((((long *)local_9c0._0_8_ != (long *)0x0) &&
                (cVar10 = testing::internal::IsTrue(true), cVar10 != '\0')) &&
               ((long *)local_9c0._0_8_ != (long *)0x0)) {
              (**(code **)(*(long *)local_9c0._0_8_ + 8))();
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_918.second,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          uVar11 = libcellml::AnyCellmlElement::type();
          switch(uVar11) {
          case 0:
            pmVar12 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_488,__k);
            puVar14 = (undefined8 *)
                      std::__any_caster<std::shared_ptr<libcellml::Component>>
                                ((any *)((long)&((pmVar12->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar16));
            if (puVar14 == (undefined8 *)0x0) {
              std::__throw_bad_any_cast();
            }
            local_9c0._0_8_ = *puVar14;
            local_9c0.second._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)puVar14[1];
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9c0.second._M_manager + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9c0.second._M_manager + 8) + 1;
              }
            }
            libcellml::AnyCellmlElement::component();
            testing::internal::
            CmpHelperEQ<std::shared_ptr<libcellml::Component>,std::shared_ptr<libcellml::Component>>
                      ((internal *)&local_918,
                       "std::any_cast<libcellml::ComponentPtr>(expectedItems[id][index].second)",
                       "item->component()",(shared_ptr<libcellml::Component> *)&local_9c0,
                       (shared_ptr<libcellml::Component> *)&local_850);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_850.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_850.second._M_manager
                        );
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager
                        );
            }
            if ((undefined1)local_918.first == COMPONENT) {
              testing::Message::Message((Message *)&local_9c0);
              pcVar17 = "";
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_918.second._M_manager !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                pcVar17 = *(char **)local_918.second._M_manager;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_850,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x7bd,pcVar17);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_850,(Message *)&local_9c0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_850);
              if ((((long *)local_9c0._0_8_ != (long *)0x0) &&
                  (cVar10 = testing::internal::IsTrue(true), cVar10 != '\0')) &&
                 ((long *)local_9c0._0_8_ != (long *)0x0)) {
                (**(code **)(*(long *)local_9c0._0_8_ + 8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_918.second,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            break;
          case 1:
            pmVar12 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_488,__k);
            puVar14 = (undefined8 *)
                      std::__any_caster<std::shared_ptr<libcellml::Component>>
                                ((any *)((long)&((pmVar12->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar16));
            if (puVar14 == (undefined8 *)0x0) {
              std::__throw_bad_any_cast();
            }
            local_9c0._0_8_ = *puVar14;
            local_9c0.second._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)puVar14[1];
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9c0.second._M_manager + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9c0.second._M_manager + 8) + 1;
              }
            }
            libcellml::AnyCellmlElement::component();
            testing::internal::
            CmpHelperEQ<std::shared_ptr<libcellml::Component>,std::shared_ptr<libcellml::Component>>
                      ((internal *)&local_918,
                       "std::any_cast<libcellml::ComponentPtr>(expectedItems[id][index].second)",
                       "item->component()",(shared_ptr<libcellml::Component> *)&local_9c0,
                       (shared_ptr<libcellml::Component> *)&local_850);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_850.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_850.second._M_manager
                        );
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager
                        );
            }
            if ((undefined1)local_918.first == COMPONENT) {
              testing::Message::Message((Message *)&local_9c0);
              pcVar17 = "";
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_918.second._M_manager !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                pcVar17 = *(char **)local_918.second._M_manager;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_850,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x7c0,pcVar17);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_850,(Message *)&local_9c0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_850);
              if ((((long *)local_9c0._0_8_ != (long *)0x0) &&
                  (cVar10 = testing::internal::IsTrue(true), cVar10 != '\0')) &&
                 ((long *)local_9c0._0_8_ != (long *)0x0)) {
                (**(code **)(*(long *)local_9c0._0_8_ + 8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_918.second,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            break;
          case 2:
            pmVar12 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_488,__k);
            pvVar13 = std::__any_caster<std::shared_ptr<libcellml::VariablePair>>
                                ((any *)((long)&((pmVar12->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar16));
            if (pvVar13 == (void *)0x0) {
              std::__throw_bad_any_cast();
            }
            p_Var21 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)pvVar13 + 8);
            if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)(p_Var21 + 8) = *(int *)(p_Var21 + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)(p_Var21 + 8) = *(int *)(p_Var21 + 8) + 1;
              }
            }
            if (local_9f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_9f0);
            }
            libcellml::AnyCellmlElement::variablePair();
            goto LAB_0015550c;
          case 3:
            pmVar12 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_488,__k);
            puVar14 = (undefined8 *)
                      std::__any_caster<std::shared_ptr<libcellml::Model>>
                                ((any *)((long)&((pmVar12->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar16));
            if (puVar14 == (undefined8 *)0x0) {
              std::__throw_bad_any_cast();
            }
            local_9c0._0_8_ = *puVar14;
            local_9c0.second._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)puVar14[1];
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9c0.second._M_manager + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9c0.second._M_manager + 8) + 1;
              }
            }
            libcellml::AnyCellmlElement::model();
            testing::internal::
            CmpHelperEQ<std::shared_ptr<libcellml::Model>,std::shared_ptr<libcellml::Model>>
                      ((internal *)&local_918,
                       "std::any_cast<libcellml::ModelPtr>(expectedItems[id][index].second)",
                       "item->model()",(shared_ptr<libcellml::Model> *)&local_9c0,
                       (shared_ptr<libcellml::Model> *)&local_850);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_850.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_850.second._M_manager
                        );
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager
                        );
            }
            if ((undefined1)local_918.first == COMPONENT) {
              testing::Message::Message((Message *)&local_9c0);
              pcVar17 = "";
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_918.second._M_manager !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                pcVar17 = *(char **)local_918.second._M_manager;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_850,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x7c7,pcVar17);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_850,(Message *)&local_9c0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_850);
              if ((((long *)local_9c0._0_8_ != (long *)0x0) &&
                  (cVar10 = testing::internal::IsTrue(true), cVar10 != '\0')) &&
                 ((long *)local_9c0._0_8_ != (long *)0x0)) {
                (**(code **)(*(long *)local_9c0._0_8_ + 8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_918.second,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            break;
          case 4:
            pmVar12 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_488,__k);
            puVar14 = (undefined8 *)
                      std::__any_caster<std::shared_ptr<libcellml::ImportSource>>
                                ((any *)((long)&((pmVar12->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar16));
            if (puVar14 == (undefined8 *)0x0) {
              std::__throw_bad_any_cast();
            }
            local_9c0._0_8_ = *puVar14;
            local_9c0.second._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)puVar14[1];
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9c0.second._M_manager + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9c0.second._M_manager + 8) + 1;
              }
            }
            libcellml::AnyCellmlElement::importSource();
            testing::internal::
            CmpHelperEQ<std::shared_ptr<libcellml::ImportSource>,std::shared_ptr<libcellml::ImportSource>>
                      ((internal *)&local_918,
                       "std::any_cast<libcellml::ImportSourcePtr>(expectedItems[id][index].second)",
                       "item->importSource()",(shared_ptr<libcellml::ImportSource> *)&local_9c0,
                       (shared_ptr<libcellml::ImportSource> *)&local_850);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_850.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_850.second._M_manager
                        );
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager
                        );
            }
            if ((undefined1)local_918.first == COMPONENT) {
              testing::Message::Message((Message *)&local_9c0);
              pcVar17 = "";
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_918.second._M_manager !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                pcVar17 = *(char **)local_918.second._M_manager;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_850,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x7ca,pcVar17);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_850,(Message *)&local_9c0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_850);
              if ((((long *)local_9c0._0_8_ != (long *)0x0) &&
                  (cVar10 = testing::internal::IsTrue(true), cVar10 != '\0')) &&
                 ((long *)local_9c0._0_8_ != (long *)0x0)) {
                (**(code **)(*(long *)local_9c0._0_8_ + 8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_918.second,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            break;
          case 5:
            pmVar12 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_488,__k);
            pvVar13 = std::__any_caster<std::shared_ptr<libcellml::VariablePair>>
                                ((any *)((long)&((pmVar12->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar16));
            if (pvVar13 == (void *)0x0) {
              std::__throw_bad_any_cast();
            }
            p_Var21 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)pvVar13 + 8);
            if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)(p_Var21 + 8) = *(int *)(p_Var21 + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)(p_Var21 + 8) = *(int *)(p_Var21 + 8) + 1;
              }
            }
            if (local_9f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_9f0);
            }
            libcellml::AnyCellmlElement::variablePair();
LAB_0015550c:
            p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_918.second._M_manager;
            local_918.first = COMPONENT;
            local_918._4_4_ = 0;
            local_918.second._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
            if ((p_Var19 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var19),
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_918.second._M_manager !=
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_918.second._M_manager
                        );
            }
            goto LAB_00155a37;
          case 7:
            pmVar12 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_488,__k);
            puVar14 = (undefined8 *)
                      std::__any_caster<std::shared_ptr<libcellml::Model>>
                                ((any *)((long)&((pmVar12->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar16));
            if (puVar14 == (undefined8 *)0x0) {
              std::__throw_bad_any_cast();
            }
            local_9c0._0_8_ = *puVar14;
            local_9c0.second._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)puVar14[1];
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9c0.second._M_manager + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9c0.second._M_manager + 8) + 1;
              }
            }
            libcellml::AnyCellmlElement::model();
            testing::internal::
            CmpHelperEQ<std::shared_ptr<libcellml::Model>,std::shared_ptr<libcellml::Model>>
                      ((internal *)&local_918,
                       "std::any_cast<libcellml::ModelPtr>(expectedItems[id][index].second)",
                       "item->model()",(shared_ptr<libcellml::Model> *)&local_9c0,
                       (shared_ptr<libcellml::Model> *)&local_850);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_850.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_850.second._M_manager
                        );
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager
                        );
            }
            if ((undefined1)local_918.first == COMPONENT) {
              testing::Message::Message((Message *)&local_9c0);
              pcVar17 = "";
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_918.second._M_manager !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                pcVar17 = *(char **)local_918.second._M_manager;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_850,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x7d1,pcVar17);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_850,(Message *)&local_9c0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_850);
              if ((((long *)local_9c0._0_8_ != (long *)0x0) &&
                  (cVar10 = testing::internal::IsTrue(true), cVar10 != '\0')) &&
                 ((long *)local_9c0._0_8_ != (long *)0x0)) {
                (**(code **)(*(long *)local_9c0._0_8_ + 8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_918.second,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            break;
          case 8:
            pmVar12 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_488,__k);
            puVar14 = (undefined8 *)
                      std::__any_caster<std::shared_ptr<libcellml::Reset>>
                                ((any *)((long)&((pmVar12->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar16));
            if (puVar14 == (undefined8 *)0x0) {
              std::__throw_bad_any_cast();
            }
            local_9c0._0_8_ = *puVar14;
            local_9c0.second._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)puVar14[1];
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9c0.second._M_manager + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9c0.second._M_manager + 8) + 1;
              }
            }
            libcellml::AnyCellmlElement::reset();
            testing::internal::
            CmpHelperEQ<std::shared_ptr<libcellml::Reset>,std::shared_ptr<libcellml::Reset>>
                      ((internal *)&local_918,
                       "std::any_cast<libcellml::ResetPtr>(expectedItems[id][index].second)",
                       "item->reset()",(shared_ptr<libcellml::Reset> *)&local_9c0,
                       (shared_ptr<libcellml::Reset> *)&local_850);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_850.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_850.second._M_manager
                        );
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager
                        );
            }
            if ((undefined1)local_918.first == COMPONENT) {
              testing::Message::Message((Message *)&local_9c0);
              pcVar17 = "";
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_918.second._M_manager !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                pcVar17 = *(char **)local_918.second._M_manager;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_850,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x7d4,pcVar17);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_850,(Message *)&local_9c0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_850);
              if ((((long *)local_9c0._0_8_ != (long *)0x0) &&
                  (cVar10 = testing::internal::IsTrue(true), cVar10 != '\0')) &&
                 ((long *)local_9c0._0_8_ != (long *)0x0)) {
                (**(code **)(*(long *)local_9c0._0_8_ + 8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_918.second,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            break;
          case 9:
            pmVar12 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_488,__k);
            puVar14 = (undefined8 *)
                      std::__any_caster<std::shared_ptr<libcellml::Reset>>
                                ((any *)((long)&((pmVar12->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar16));
            if (puVar14 == (undefined8 *)0x0) {
              std::__throw_bad_any_cast();
            }
            local_9c0._0_8_ = *puVar14;
            local_9c0.second._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)puVar14[1];
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9c0.second._M_manager + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9c0.second._M_manager + 8) + 1;
              }
            }
            libcellml::AnyCellmlElement::reset();
            testing::internal::
            CmpHelperEQ<std::shared_ptr<libcellml::Reset>,std::shared_ptr<libcellml::Reset>>
                      ((internal *)&local_918,
                       "std::any_cast<libcellml::ResetPtr>(expectedItems[id][index].second)",
                       "item->reset()",(shared_ptr<libcellml::Reset> *)&local_9c0,
                       (shared_ptr<libcellml::Reset> *)&local_850);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_850.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_850.second._M_manager
                        );
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager
                        );
            }
            if ((undefined1)local_918.first == COMPONENT) {
              testing::Message::Message((Message *)&local_9c0);
              pcVar17 = "";
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_918.second._M_manager !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                pcVar17 = *(char **)local_918.second._M_manager;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_850,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x7d7,pcVar17);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_850,(Message *)&local_9c0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_850);
              if ((((long *)local_9c0._0_8_ != (long *)0x0) &&
                  (cVar10 = testing::internal::IsTrue(true), cVar10 != '\0')) &&
                 ((long *)local_9c0._0_8_ != (long *)0x0)) {
                (**(code **)(*(long *)local_9c0._0_8_ + 8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_918.second,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            break;
          case 10:
            pmVar12 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_488,__k);
            puVar14 = (undefined8 *)
                      std::__any_caster<std::shared_ptr<libcellml::Reset>>
                                ((any *)((long)&((pmVar12->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar16));
            if (puVar14 == (undefined8 *)0x0) {
              std::__throw_bad_any_cast();
            }
            local_9c0._0_8_ = *puVar14;
            local_9c0.second._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)puVar14[1];
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9c0.second._M_manager + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9c0.second._M_manager + 8) + 1;
              }
            }
            libcellml::AnyCellmlElement::reset();
            testing::internal::
            CmpHelperEQ<std::shared_ptr<libcellml::Reset>,std::shared_ptr<libcellml::Reset>>
                      ((internal *)&local_918,
                       "std::any_cast<libcellml::ResetPtr>(expectedItems[id][index].second)",
                       "item->reset()",(shared_ptr<libcellml::Reset> *)&local_9c0,
                       (shared_ptr<libcellml::Reset> *)&local_850);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_850.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_850.second._M_manager
                        );
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager
                        );
            }
            if ((undefined1)local_918.first == COMPONENT) {
              testing::Message::Message((Message *)&local_9c0);
              pcVar17 = "";
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_918.second._M_manager !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                pcVar17 = *(char **)local_918.second._M_manager;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_850,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x7da,pcVar17);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_850,(Message *)&local_9c0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_850);
              if ((((long *)local_9c0._0_8_ != (long *)0x0) &&
                  (cVar10 = testing::internal::IsTrue(true), cVar10 != '\0')) &&
                 ((long *)local_9c0._0_8_ != (long *)0x0)) {
                (**(code **)(*(long *)local_9c0._0_8_ + 8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_918.second,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            break;
          case 0xc:
            pmVar12 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_488,__k);
            pvVar13 = std::__any_caster<std::shared_ptr<libcellml::UnitsItem>>
                                ((any *)((long)&((pmVar12->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar16));
            if (pvVar13 == (void *)0x0) {
              std::__throw_bad_any_cast();
            }
            local_560 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)pvVar13 + 8);
            if (local_560 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)(local_560 + 8) = *(int *)(local_560 + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)(local_560 + 8) = *(int *)(local_560 + 8) + 1;
              }
            }
            libcellml::AnyCellmlElement::unitsItem();
            libcellml::UnitsItem::units();
            libcellml::UnitsItem::units();
            testing::internal::
            CmpHelperEQ<std::shared_ptr<libcellml::Units>,std::shared_ptr<libcellml::Units>>
                      ((internal *)&local_9c0,"ue->units()","ua->units()",
                       (shared_ptr<libcellml::Units> *)&local_850,&local_7a8);
            if (local_7a8.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_7a8.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_850.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_850.second._M_manager
                        );
            }
            if ((undefined1)local_9c0.first == COMPONENT) {
              testing::Message::Message((Message *)&local_850);
              pcVar17 = "";
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                pcVar17 = *(char **)local_9c0.second._M_manager;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_7a8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x7df,pcVar17);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_7a8,(Message *)&local_850);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_7a8);
              if ((((long *)local_850._0_8_ != (long *)0x0) &&
                  (cVar10 = testing::internal::IsTrue(true), cVar10 != '\0')) &&
                 ((long *)local_850._0_8_ != (long *)0x0)) {
                (**(code **)(*(long *)local_850._0_8_ + 8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_9c0.second,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            local_850._0_8_ = libcellml::UnitsItem::index();
            local_7a8.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)libcellml::UnitsItem::index();
            testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                      ((internal *)&local_9c0,"ue->index()","ua->index()",
                       (unsigned_long *)&local_850,(unsigned_long *)&local_7a8);
            if ((undefined1)local_9c0.first == COMPONENT) {
              testing::Message::Message((Message *)&local_850);
              pcVar17 = "";
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                pcVar17 = *(char **)local_9c0.second._M_manager;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_7a8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x7e0,pcVar17);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_7a8,(Message *)&local_850);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_7a8);
              if ((((long *)local_850._0_8_ != (long *)0x0) &&
                  (cVar10 = testing::internal::IsTrue(true), cVar10 != '\0')) &&
                 ((long *)local_850._0_8_ != (long *)0x0)) {
                (**(code **)(*(long *)local_850._0_8_ + 8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_9c0.second,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_918.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_918.second._M_manager
                        );
            }
            if (local_560 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_560);
            }
            break;
          case 0xd:
            pmVar12 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_488,__k);
            puVar14 = (undefined8 *)
                      std::__any_caster<std::shared_ptr<libcellml::Units>>
                                ((any *)((long)&((pmVar12->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar16));
            if (puVar14 == (undefined8 *)0x0) {
              std::__throw_bad_any_cast();
            }
            local_9c0._0_8_ = *puVar14;
            local_9c0.second._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)puVar14[1];
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9c0.second._M_manager + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9c0.second._M_manager + 8) + 1;
              }
            }
            libcellml::AnyCellmlElement::units();
            testing::internal::
            CmpHelperEQ<std::shared_ptr<libcellml::Units>,std::shared_ptr<libcellml::Units>>
                      ((internal *)&local_918,
                       "std::any_cast<libcellml::UnitsPtr>(expectedItems[id][index].second)",
                       "item->units()",(shared_ptr<libcellml::Units> *)&local_9c0,
                       (shared_ptr<libcellml::Units> *)&local_850);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_850.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_850.second._M_manager
                        );
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager
                        );
            }
            if ((undefined1)local_918.first == COMPONENT) {
              testing::Message::Message((Message *)&local_9c0);
              pcVar17 = "";
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_918.second._M_manager !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                pcVar17 = *(char **)local_918.second._M_manager;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_850,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x7e4,pcVar17);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_850,(Message *)&local_9c0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_850);
              if ((((long *)local_9c0._0_8_ != (long *)0x0) &&
                  (cVar10 = testing::internal::IsTrue(true), cVar10 != '\0')) &&
                 ((long *)local_9c0._0_8_ != (long *)0x0)) {
                (**(code **)(*(long *)local_9c0._0_8_ + 8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_918.second,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            break;
          case 0xe:
            pmVar12 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_488,__k);
            puVar14 = (undefined8 *)
                      std::__any_caster<std::shared_ptr<libcellml::Variable>>
                                ((any *)((long)&((pmVar12->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar16));
            if (puVar14 == (undefined8 *)0x0) {
              std::__throw_bad_any_cast();
            }
            local_9c0._0_8_ = *puVar14;
            local_9c0.second._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)puVar14[1];
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9c0.second._M_manager + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager
                        + 8) = *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_9c0.second._M_manager + 8) + 1;
              }
            }
            libcellml::AnyCellmlElement::variable();
            testing::internal::
            CmpHelperEQ<std::shared_ptr<libcellml::Variable>,std::shared_ptr<libcellml::Variable>>
                      ((internal *)&local_918,
                       "std::any_cast<libcellml::VariablePtr>(expectedItems[id][index].second)",
                       "item->variable()",(shared_ptr<libcellml::Variable> *)&local_9c0,
                       (shared_ptr<libcellml::Variable> *)&local_850);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_850.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_850.second._M_manager
                        );
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c0.second._M_manager
                        );
            }
            if ((undefined1)local_918.first == COMPONENT) {
              testing::Message::Message((Message *)&local_9c0);
              pcVar17 = "";
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_918.second._M_manager !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                pcVar17 = *(char **)local_918.second._M_manager;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_850,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x7e7,pcVar17);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_850,(Message *)&local_9c0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_850);
              if ((((long *)local_9c0._0_8_ != (long *)0x0) &&
                  (cVar10 = testing::internal::IsTrue(true), cVar10 != '\0')) &&
                 ((long *)local_9c0._0_8_ != (long *)0x0)) {
                (**(code **)(*(long *)local_9c0._0_8_ + 8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_918.second,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          p_Var9 = p_Var19;
          p_Var21 = local_9f0;
LAB_00155a37:
          p_Var19 = p_Var9;
          if ((pointer)local_788._8_8_ != (pointer)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_788._8_8_);
          }
          lVar18 = lVar18 + 1;
          lVar16 = lVar16 + 0x18;
          local_9f0 = p_Var21;
        } while (lVar20 != lVar18);
      }
      __k = __k + 1;
      local_9f0 = p_Var21;
    } while (__k != local_1f8);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_548.second._M_manager !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_548.second._M_manager);
  }
  if (p_Var19 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var19);
  }
  if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var21);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
  ::~_Rb_tree(&local_488);
  if (local_6a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_6a0);
  }
  if (local_550 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_550);
  }
  if (local_670 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_670);
  }
  if (local_690 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_690);
  }
  if (local_680 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_680);
  }
  if (local_9d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_9d0);
  }
  if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_150);
  return;
}

Assistant:

TEST(Annotator, duplicateIdBehaviour)
{
    auto model = libcellml::Model::create("model");
    auto annotator = libcellml::Annotator::create();
    auto component = libcellml::Component::create();
    auto variable = libcellml::Variable::create();

    model->setId("duplicateId");
    component->setId("duplicateId");
    variable->setId("duplicateId");

    component->addVariable(variable);
    model->addComponent(component);

    annotator->setModel(model);

    EXPECT_EQ(libcellml::CellmlElementType::UNDEFINED, annotator->item("duplicateId")->type());
    EXPECT_EQ(size_t(1), annotator->issueCount());

    EXPECT_FALSE(annotator->isUnique("duplicateId"));
    EXPECT_EQ(size_t(3), annotator->itemCount("duplicateId"));
}